

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O3

int ftp_status(FILE *ftp,char *statusstr)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char errorstr [100];
  char recbuf [1200];
  char acStack_558 [112];
  char local_4e8 [1208];
  
  sVar2 = strlen(statusstr);
  pcVar3 = fgets(local_4e8,0x4b0,(FILE *)ftp);
  if (pcVar3 != (char *)0x0) {
    do {
      local_4e8[(int)sVar2] = '\0';
      iVar1 = strcmp(local_4e8,statusstr);
      if (iVar1 == 0) {
        return 0;
      }
      if ('3' < local_4e8[0]) {
        snprintf(acStack_558,100,"ERROR ftp_status wants %s but got %s",statusstr,local_4e8);
        ffpmsg(acStack_558);
        iVar1 = atoi(local_4e8);
        return iVar1 + (uint)(iVar1 == 0);
      }
      snprintf(acStack_558,100,"ERROR ftp_status wants %s but got unexpected %s",statusstr,local_4e8
              );
      ffpmsg(acStack_558);
      pcVar3 = fgets(local_4e8,0x4b0,(FILE *)ftp);
    } while (pcVar3 != (char *)0x0);
  }
  snprintf(acStack_558,100,"ERROR: ftp_status wants %s but fgets returned 0",statusstr);
  ffpmsg(acStack_558);
  return 1;
}

Assistant:

static int ftp_status(FILE *ftp, char *statusstr)
{
  /* read through until we find a string beginning with statusstr */
  /* This needs a timeout */
  
  /* Modified 2/19 to return the numerical value of the returned status when
     it differs from the requested status. */

  char recbuf[MAXLEN], errorstr[SHORTLEN];
  int len, ftpcode=0;

  len = strlen(statusstr);
  while (1) {

    if (!(fgets(recbuf,MAXLEN,ftp))) {
      snprintf(errorstr,SHORTLEN,"ERROR: ftp_status wants %s but fgets returned 0",statusstr);
      ffpmsg(errorstr);
      return 1; /* error reading */
    }

    recbuf[len] = '\0'; /* make it short */
    if (!strcmp(recbuf,statusstr)) {
      return 0; /* we're ok */
    }
    if (recbuf[0] > '3') {
      /* oh well, some sort of error. */
      snprintf(errorstr,SHORTLEN,"ERROR ftp_status wants %s but got %s", statusstr, recbuf);
      ffpmsg(errorstr);
      /* Return the numerical code, if string can be converted to int.
         But must not return 0 from here. */
      ftpcode = atoi(recbuf);
      return ftpcode ? ftpcode : 1; 
    }
    snprintf(errorstr,SHORTLEN,"ERROR ftp_status wants %s but got unexpected %s", statusstr, recbuf);
    ffpmsg(errorstr);
  }
}